

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

ptrdiff_t __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
::reMax(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
        *this,int newmax)

{
  Item *pIVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
  *in_RDI;
  Item **unaff_retaddr;
  int in_stack_0000000c;
  DataKey **in_stack_00000010;
  ptrdiff_t pshift;
  int *lastfree;
  Item *newMem;
  int i;
  DLPSV *in_stack_ffffffffffffffb8;
  int iVar4;
  int *local_20;
  int local_10;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
  *pCVar5;
  
  pCVar5 = in_RDI;
  iVar2 = size(in_RDI);
  iVar4 = (int)((ulong)pCVar5 >> 0x20);
  if (in_ESI < iVar2) {
    in_ESI = size(in_RDI);
  }
  for (local_20 = &in_RDI->firstfree; *local_20 != -1 - in_RDI->themax;
      local_20 = &in_RDI->theitem[-1 - *local_20].info) {
  }
  *local_20 = -1 - in_ESI;
  iVar2 = in_ESI;
  spx_alloc<soplex::ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>::DLPSV>::Item*>
            (unaff_retaddr,iVar4);
  local_10 = 0;
  while (iVar4 = local_10, iVar3 = max(in_RDI), iVar4 < iVar3) {
    SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::DLPSV::operator=((DLPSV *)CONCAT44(iVar2,iVar4),in_stack_ffffffffffffffb8);
    *(int *)((long)local_10 * 0x28 + 0x20) = in_RDI->theitem[local_10].info;
    local_10 = local_10 + 1;
  }
  for (; local_10 < in_ESI; local_10 = local_10 + 1) {
    memset((void *)((long)local_10 * 0x28),0,0x28);
    Item::Item((Item *)0x1c9260);
  }
  pIVar1 = in_RDI->theitem;
  spx_free<soplex::ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>::DLPSV>::Item*>
            ((Item **)0x1c9287);
  in_RDI->theitem = (Item *)0x0;
  in_RDI->themax = in_ESI;
  spx_realloc<soplex::DataKey*>(in_stack_00000010,in_stack_0000000c);
  return -(long)pIVar1;
}

Assistant:

ptrdiff_t reMax(int newmax = 0)
   {
      int i;
      Item* newMem = nullptr;
      newmax = (newmax < size()) ? size() : newmax;

      int* lastfree = &firstfree;

      while(*lastfree != -themax - 1)
         lastfree = &(theitem[ -1 - *lastfree].info);

      *lastfree = -newmax - 1;

      spx_alloc(newMem, newmax);

      /* call copy constructor for first elements */
      for(i = 0; i < max(); i++)
      {
         newMem[i].data = std::move(theitem[i].data);
         newMem[i].info = theitem[i].info;
      }

      /* call default constructor for remaining elements */
      for(; i < newmax; i++)
         new(&(newMem[i])) Item();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(theitem);

      spx_free(theitem);

      theitem = newMem;
      themax = newmax;

      spx_realloc(thekey,  themax);

      return pshift;
   }